

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O3

void Gia_LutDelayTraceSortPins(Gia_Man_t *p,int iObj,int *pPinPerm,float *pPinDelays)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  
  if (-1 < iObj) {
    pVVar2 = p->vMapping;
    uVar8 = pVVar2->nSize;
    if (iObj < (int)uVar8) {
      piVar3 = pVVar2->pArray;
      if (piVar3[(uint)iObj] == 0) {
        __assert_fail("Gia_ObjIsLut(p, iObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                      ,0x31,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
      }
      lVar5 = 0;
      do {
        lVar11 = (long)piVar3[(uint)iObj];
        if ((lVar11 < 0) || (uVar8 <= (uint)piVar3[(uint)iObj])) break;
        if (piVar3[lVar11] <= lVar5) {
          if (iObj < (int)uVar8) {
            uVar7 = 1;
            uVar4 = 0;
            goto LAB_00228e0a;
          }
          break;
        }
        iVar1 = piVar3[lVar11 + lVar5 + 1];
        pPinPerm[lVar5] = (int)lVar5;
        if (iVar1 < 0) {
LAB_00228eeb:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecFlt.h"
                        ,0x16e,"float Vec_FltEntry(Vec_Flt_t *, int)");
        }
        uVar6 = iVar1 * 3;
        uVar8 = p->vTiming->nSize;
        if (uVar8 == uVar6 || SBORROW4(uVar8,uVar6) != (int)(uVar8 + iVar1 * -3) < 0)
        goto LAB_00228eeb;
        pPinDelays[lVar5] = p->vTiming->pArray[uVar6];
        lVar5 = lVar5 + 1;
        uVar8 = pVVar2->nSize;
      } while (iObj < (int)uVar8);
    }
  }
  goto LAB_00228e83;
  while( true ) {
    uVar6 = piVar3[(int)uVar6];
    uVar9 = (ulong)uVar6;
    if ((long)(int)uVar6 + -1 <= (long)uVar4) {
      if (uVar9 != 0) {
        if ((int)uVar6 <= *pPinPerm) {
          __assert_fail("Gia_ObjLutSize(p, iObj) == 0 || pPinPerm[0] < Gia_ObjLutSize(p, iObj)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                        ,0x47,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)");
        }
        if (1 < (int)uVar6) {
          uVar4 = 1;
          do {
            if ((int)uVar6 <= pPinPerm[uVar4]) {
              __assert_fail("pPinPerm[i] < Gia_ObjLutSize(p, iObj)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                            ,0x4a,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)"
                           );
            }
            if (pPinDelays[pPinPerm[uVar4 - 1]] < pPinDelays[pPinPerm[uVar4]]) {
              __assert_fail("pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSpeedup.c"
                            ,0x4b,"void Gia_LutDelayTraceSortPins(Gia_Man_t *, int, int *, float *)"
                           );
            }
            uVar4 = uVar4 + 1;
          } while (uVar9 != uVar4);
        }
      }
      return;
    }
    uVar10 = uVar4 & 0xffffffff;
    uVar12 = uVar7;
    do {
      uVar6 = (uint)uVar12;
      if (pPinDelays[pPinPerm[uVar12]] < pPinDelays[pPinPerm[(int)(uint)uVar10]] ||
          pPinDelays[pPinPerm[uVar12]] == pPinDelays[pPinPerm[(int)(uint)uVar10]]) {
        uVar6 = (uint)uVar10;
      }
      uVar12 = uVar12 + 1;
      uVar10 = (ulong)uVar6;
    } while (uVar9 != uVar12);
    if (uVar4 != uVar6) {
      iVar1 = pPinPerm[uVar4];
      pPinPerm[uVar4] = pPinPerm[(int)uVar6];
      pPinPerm[(int)uVar6] = iVar1;
      uVar8 = pVVar2->nSize;
    }
    uVar7 = uVar7 + 1;
    uVar4 = uVar4 + 1;
    if ((int)uVar8 <= iObj) break;
LAB_00228e0a:
    uVar6 = piVar3[(uint)iObj];
    if (((long)(int)uVar6 < 0) || (uVar8 <= uVar6)) break;
  }
LAB_00228e83:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Sorts the pins in the decreasing order of delays.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Gia_LutDelayTraceSortPins( Gia_Man_t * p, int iObj, int * pPinPerm, float * pPinDelays )
{
    int iFanin, i, j, best_i, temp;
    assert( Gia_ObjIsLut(p, iObj) );
    // start the trivial permutation and collect pin delays
    Gia_LutForEachFanin( p, iObj, iFanin, i )
    {
        pPinPerm[i] = i;
        pPinDelays[i] = Gia_ObjTimeArrival(p, iFanin);
    }
    // selection sort the pins in the decreasible order of delays
    // this order will match the increasing order of LUT input pins
    for ( i = 0; i < Gia_ObjLutSize(p, iObj)-1; i++ )
    {
        best_i = i;
        for ( j = i+1; j < Gia_ObjLutSize(p, iObj); j++ )
            if ( pPinDelays[pPinPerm[j]] > pPinDelays[pPinPerm[best_i]] )
                best_i = j;
        if ( best_i == i )
            continue;
        temp = pPinPerm[i]; 
        pPinPerm[i] = pPinPerm[best_i]; 
        pPinPerm[best_i] = temp;
    }
    // verify
    assert( Gia_ObjLutSize(p, iObj) == 0 || pPinPerm[0] < Gia_ObjLutSize(p, iObj) );
    for ( i = 1; i < Gia_ObjLutSize(p, iObj); i++ )
    {
        assert( pPinPerm[i] < Gia_ObjLutSize(p, iObj) );
        assert( pPinDelays[pPinPerm[i-1]] >= pPinDelays[pPinPerm[i]] );
    }
}